

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.cpp
# Opt level: O2

void __thiscall
Printer_prettyPrintNoSpacesNewlines_Test::TestBody(Printer_prettyPrintNoSpacesNewlines_Test *this)

{
  element_type *peVar1;
  char *pcVar2;
  AssertHelper aAStack_98 [8];
  ComponentPtr component2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  AssertionResult gtest_ar;
  string equation2;
  ModelPtr model;
  PrinterPtr printer;
  
  libcellml::Printer::create();
  libcellml::Model::create();
  peVar1 = model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&equation2,"model",(allocator<char> *)&local_80);
  libcellml::NamedEntity::setName((string *)peVar1);
  std::__cxx11::string::~string((string *)&equation2);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&equation2,"component",(allocator<char> *)&local_80);
  libcellml::Component::create((string *)&component2);
  std::__cxx11::string::~string((string *)&equation2);
  libcellml::ComponentEntity::addComponent
            ((shared_ptr *)
             model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&equation2,
             "<apply><eq/>\n<apply><diff/>\n<bvar><ci>t</ci></bvar>\n<ci>X</ci>\n</apply>\n<apply><minus/>\n<apply><times/>\n<ci>alpha_X</ci>\n<apply><minus/>\n<cn cellml:units=\"dimensionless\">1</cn>\n<ci>X</ci>\n</apply>\n</apply>\n<apply><times/>\n<ci>beta_X</ci>\n<ci>X</ci>\n</apply>\n</apply>\n</apply>\n"
             ,(allocator<char> *)&local_80);
  libcellml::Component::setMath
            ((string *)
             component2.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
  ;
  libcellml::Component::appendMath
            ((string *)
             component2.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
  ;
  libcellml::Component::appendMath
            ((string *)
             component2.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
  ;
  libcellml::Printer::printModel_abi_cxx11_
            ((shared_ptr *)&local_80,
             (bool)printer.super___shared_ptr<libcellml::Printer,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                   ._0_1_);
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&gtest_ar,"PRETTY_MODEL_STRING","printer->printModel(model)",
             &PRETTY_MODEL_STRING_abi_cxx11_,&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_80);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (aAStack_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/printer/printer.cpp"
               ,0x36e,pcVar2);
    testing::internal::AssertHelper::operator=(aAStack_98,(Message *)&local_80);
    testing::internal::AssertHelper::~AssertHelper(aAStack_98);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_80);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  std::__cxx11::string::~string((string *)&equation2);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&component2.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&printer.super___shared_ptr<libcellml::Printer,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            );
  return;
}

Assistant:

TEST(Printer, prettyPrintNoSpacesNewlines)
{
    auto printer = libcellml::Printer::create();
    auto model = libcellml::Model::create();
    model->setName("model");

    auto component2 = libcellml::Component::create("component");
    model->addComponent(component2);
    const std::string equation2 =
        "<apply><eq/>\n"
        "<apply><diff/>\n"
        "<bvar><ci>t</ci></bvar>\n"
        "<ci>X</ci>\n"
        "</apply>\n"
        "<apply><minus/>\n"
        "<apply><times/>\n"
        "<ci>alpha_X</ci>\n"
        "<apply><minus/>\n"
        "<cn cellml:units=\"dimensionless\">1</cn>\n"
        "<ci>X</ci>\n"
        "</apply>\n"
        "</apply>\n"
        "<apply><times/>\n"
        "<ci>beta_X</ci>\n"
        "<ci>X</ci>\n"
        "</apply>\n"
        "</apply>\n"
        "</apply>\n";

    component2->setMath(MATH_HEADER);
    component2->appendMath(equation2);
    component2->appendMath(MATH_FOOTER);

    EXPECT_EQ(PRETTY_MODEL_STRING, printer->printModel(model));
}